

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O2

Rule * Parser::getLCP(Rule *__return_storage_ptr__,Rule *a,Rule *b)

{
  pointer pNVar1;
  pointer pNVar2;
  int i;
  ulong uVar3;
  
  (__return_storage_ptr__->rights).super__Vector_base<Parser::Node,_std::allocator<Parser::Node>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->rights).super__Vector_base<Parser::Node,_std::allocator<Parser::Node>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->rights).super__Vector_base<Parser::Node,_std::allocator<Parser::Node>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pNVar1 = (a->rights).super__Vector_base<Parser::Node,_std::allocator<Parser::Node>_>._M_impl.
           super__Vector_impl_data._M_start;
  pNVar2 = (a->rights).super__Vector_base<Parser::Node,_std::allocator<Parser::Node>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if ((pNVar1 != pNVar2) &&
     ((b->rights).super__Vector_base<Parser::Node,_std::allocator<Parser::Node>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (b->rights).super__Vector_base<Parser::Node,_std::allocator<Parser::Node>_>._M_impl.
      super__Vector_impl_data._M_finish)) {
    uVar3 = 0;
    while ((((uVar3 < (ulong)((long)pNVar2 - (long)pNVar1 >> 3) &&
             (pNVar2 = (b->rights).super__Vector_base<Parser::Node,_std::allocator<Parser::Node>_>.
                       _M_impl.super__Vector_impl_data._M_start,
             uVar3 < (ulong)((long)(b->rights).
                                   super__Vector_base<Parser::Node,_std::allocator<Parser::Node>_>.
                                   _M_impl.super__Vector_impl_data._M_finish - (long)pNVar2 >> 3)))
            && (pNVar1[uVar3].isEnd == pNVar2[uVar3].isEnd)) &&
           (pNVar1[uVar3].id == pNVar2[uVar3].id))) {
      std::vector<Parser::Node,_std::allocator<Parser::Node>_>::push_back
                (&__return_storage_ptr__->rights,pNVar1 + uVar3);
      uVar3 = uVar3 + 1;
      pNVar2 = (a->rights).super__Vector_base<Parser::Node,_std::allocator<Parser::Node>_>._M_impl.
               super__Vector_impl_data._M_finish;
      pNVar1 = (a->rights).super__Vector_base<Parser::Node,_std::allocator<Parser::Node>_>._M_impl.
               super__Vector_impl_data._M_start;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Rule getLCP(const Rule& a,const Rule& b){
        Rule res;
        res.rights.clear();
        if(a.isNone()||b.isNone()) return res;
        for(int i = 0;i < a.rights.size() && i < b.rights.size();i++){
            if(a.rights[i] == b.rights[i]) res.rights.push_back(a.rights[i]);
            else break;
        }
        return res;
    }